

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O0

quint32 __thiscall Http2::Frame::hpackBlockSize(Frame *this)

{
  FrameType FVar1;
  Frame *in_RDI;
  Frame *unaff_retaddr;
  quint32 size;
  FrameType frameType;
  undefined4 local_10;
  
  FVar1 = type(in_RDI);
  local_10 = dataSize(unaff_retaddr);
  if (FVar1 == PUSH_PROMISE) {
    local_10 = local_10 - 4;
  }
  return local_10;
}

Assistant:

quint32 Frame::hpackBlockSize() const
{
    Q_ASSERT(validatePayload() == FrameStatus::goodFrame);

    const auto frameType = type();
    Q_ASSERT(frameType == FrameType::HEADERS ||
             frameType == FrameType::PUSH_PROMISE ||
             frameType == FrameType::CONTINUATION);

    quint32 size = dataSize();
    if (frameType == FrameType::PUSH_PROMISE) {
        Q_ASSERT(size >= 4);
        size -= 4;
    }

    return size;
}